

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImGuiID __thiscall ImGuiWindow::GetIDFromRectangle(ImGuiWindow *this,ImRect *r_abs)

{
  ImVec2 IVar1;
  ImGuiContext *pIVar2;
  uint uVar3;
  long lVar4;
  float fVar5;
  float fVar6;
  ImRect r_rel;
  float local_10;
  float fStack_c;
  float fStack_8;
  float fStack_4;
  
  pIVar2 = GImGui;
  lVar4 = (long)(this->IDStack).Size;
  if (0 < lVar4) {
    IVar1 = (this->DC).CursorStartPos;
    fVar5 = IVar1.x;
    fVar6 = IVar1.y;
    local_10 = (r_abs->Min).x - fVar5;
    fStack_c = (r_abs->Min).y - fVar6;
    fStack_8 = (r_abs->Max).x - fVar5;
    fStack_4 = (r_abs->Max).y - fVar6;
    uVar3 = ~(this->IDStack).Data[lVar4 + -1];
    lVar4 = 0;
    do {
      uVar3 = uVar3 >> 8 ^
              GCrc32LookupTable[(uint)*(byte *)((long)&local_10 + lVar4) ^ uVar3 & 0xff];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x10);
    uVar3 = ~uVar3;
    if (GImGui->ActiveId == uVar3) {
      GImGui->ActiveIdIsAlive = uVar3;
    }
    if (pIVar2->ActiveIdPreviousFrame == uVar3) {
      pIVar2->ActiveIdPreviousFrameIsAlive = true;
    }
    return uVar3;
  }
  __assert_fail("Size > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.h"
                ,0x70b,"T &ImVector<unsigned int>::back() [T = unsigned int]");
}

Assistant:

ImGuiID ImGuiWindow::GetIDFromRectangle(const ImRect& r_abs)
{
    ImGuiID seed = IDStack.back();
    ImRect r_rel = ImGui::WindowRectAbsToRel(this, r_abs);
    ImGuiID id = ImHashData(&r_rel, sizeof(r_rel), seed);
    ImGui::KeepAliveID(id);
    return id;
}